

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdVerifyEcSignature(void *handle,char *sighash,char *pubkey,char *signature)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  bool is_verify;
  Pubkey pubkey_obj;
  string *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffdd0;
  allocator local_1b1;
  string local_1b0;
  ByteData local_190;
  allocator local_171;
  string local_170;
  ByteData256 local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130;
  Pubkey local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0xaf;
    local_50.funcname = "CfdVerifyEcSignature";
    cfd::core::logger::warn<>(&local_50,"sighash is null or empty.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"Failed to parameter. sighash is null or empty.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_28);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,local_20,&local_131);
      cfd::core::Pubkey::Pubkey(&local_110,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,local_18,&local_171);
      cfd::core::ByteData256::ByteData256(&local_150,&local_170);
      paVar3 = &local_1b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,local_28,paVar3);
      cfd::core::ByteData::ByteData(&local_190,&local_1b0);
      bVar1 = cfd::core::Pubkey::VerifyEcSignature(&local_110,&local_150,&local_190);
      cfd::core::ByteData::~ByteData((ByteData *)0x5cae11);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5cae38);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = 7;
      }
      local_132 = bVar1;
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5cb0cf);
      return local_4;
    }
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0xbb;
    local_d0.funcname = "CfdVerifyEcSignature";
    cfd::core::logger::warn<>(&local_d0,"signature is null or empty.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,"Failed to parameter. signature is null or empty.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0xb5;
  local_90.funcname = "CfdVerifyEcSignature";
  cfd::core::logger::warn<>(&local_90,"pubkey is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. pubkey is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyEcSignature(
    void* handle, const char* sighash, const char* pubkey,
    const char* signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(sighash)) {
      warn(CFD_LOG_SOURCE, "sighash is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }

    Pubkey pubkey_obj(pubkey);
    bool is_verify = pubkey_obj.VerifyEcSignature(
        ByteData256(sighash), ByteData(signature));
    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}